

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_params.h
# Opt level: O2

bool __thiscall
google::protobuf::compiler::javanano::Params::java_multiple_files(Params *this,string *file_name)

{
  const_iterator cVar1;
  
  if (this->override_java_multiple_files_ == JAVANANO_MUL_FALSE) {
    return false;
  }
  if (this->override_java_multiple_files_ == JAVANANO_MUL_TRUE) {
    return true;
  }
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&(this->java_multiple_files_)._M_t,file_name);
  return (_Rb_tree_header *)cVar1._M_node !=
         &(this->java_multiple_files_)._M_t._M_impl.super__Rb_tree_header;
}

Assistant:

bool java_multiple_files(const string& file_name) const {
    switch (override_java_multiple_files_) {
      case JAVANANO_MUL_FALSE:
        return false;
      case JAVANANO_MUL_TRUE:
        return true;
      default:
        return java_multiple_files_.find(file_name)
                != java_multiple_files_.end();
    }
  }